

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::finalizeMemory(TranslateToFuzzReader *this)

{
  Module *pMVar1;
  pointer ppGVar2;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *memory;
  long lVar3;
  Const *pCVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  pointer ppGVar8;
  long *plVar9;
  Name NVar10;
  Literal local_88;
  Builder *local_70;
  ulong local_68;
  long *local_60;
  FindAll<wasm::GlobalGet> local_58;
  TranslateToFuzzReader *local_40;
  long *local_38;
  
  pMVar1 = this->wasm;
  local_38 = *(long **)(pMVar1 + 0x78);
  plVar9 = *(long **)(pMVar1 + 0x90);
  plVar5 = *(long **)(pMVar1 + 0x98);
  if (plVar9 != plVar5) {
    local_70 = &this->builder;
    local_60 = plVar5;
    local_40 = this;
    do {
      lVar3 = *plVar9;
      uVar6 = *(long *)(lVar3 + 0x40) - *(long *)(lVar3 + 0x38);
      if (*(char *)(lVar3 + 0x28) == '\0') {
        if (((byte)this->wasm[0x179] & 4) == 0) {
          local_68 = uVar6;
          FindAll<wasm::GlobalGet>::FindAll(&local_58,*(Expression **)(*plVar9 + 0x30));
          ppGVar2 = local_58.list.
                    super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppGVar8 = local_58.list.
                         super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>.
                         _M_impl.super__Vector_impl_data._M_start; ppGVar8 != ppGVar2;
              ppGVar8 = ppGVar8 + 1) {
            NVar10.super_IString.str._M_str = (char *)((*ppGVar8)->name).super_IString.str._M_len;
            NVar10.super_IString.str._M_len = (size_t)local_40->wasm;
            lVar3 = wasm::Module::getGlobal(NVar10);
            if (*(long *)(lVar3 + 0x20) != 0) {
              __assert_fail("!wasm.getGlobal(get->name)->imported()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                            ,0x2f2,"void wasm::TranslateToFuzzReader::finalizeMemory()");
            }
            Literal::makeFromInt32(&local_88,0,(Type)*(uintptr_t *)(*local_38 + 0x50));
            pCVar4 = Builder::makeConst(local_70,&local_88);
            *(Const **)(*plVar9 + 0x30) = pCVar4;
            wasm::Literal::~Literal(&local_88);
          }
          plVar5 = local_60;
          uVar6 = local_68;
          this = local_40;
          if (local_58.list.
              super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.list.
                            super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_58.list.
                                  super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.list.
                                  super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            plVar5 = local_60;
            uVar6 = local_68;
            this = local_40;
          }
        }
        if (**(char **)(*plVar9 + 0x30) == '\x0e') {
          lVar3 = wasm::Literal::getInteger();
          uVar6 = uVar6 + lVar3;
        }
      }
      if (uVar6 < 0x40000001) {
        uVar7 = uVar6 + 0xffff >> 0x10;
        uVar6 = *(ulong *)(*local_38 + 0x38);
        if (uVar7 < uVar6) {
          uVar7 = uVar6;
        }
        *(ulong *)(*local_38 + 0x38) = uVar7;
      }
      plVar9 = plVar9 + 1;
    } while (plVar9 != plVar5);
  }
  lVar3 = *local_38;
  uVar6 = (this->fuzzParams->super_FuzzParams).USABLE_MEMORY.addr;
  if (uVar6 < *(ulong *)(lVar3 + 0x38)) {
    uVar6 = *(ulong *)(lVar3 + 0x38);
  }
  *(ulong *)(lVar3 + 0x38) = uVar6;
  if (*(long *)(lVar3 + 0x40) == -1) {
    *(ulong *)(lVar3 + 0x40) = uVar6;
  }
  if (*(ulong *)(lVar3 + 0x40) <= *(ulong *)(lVar3 + 0x38)) {
    uVar6 = *(ulong *)(lVar3 + 0x38) + 1;
    if (0xffff < uVar6) {
      uVar6 = 0x10000;
    }
    *(ulong *)(lVar3 + 0x40) = uVar6;
  }
  if (this->preserveImportsAndExports == false) {
    plVar5 = *(long **)(this->wasm + 0x80);
    for (plVar9 = *(long **)(this->wasm + 0x78); plVar9 != plVar5; plVar9 = plVar9 + 1) {
      lVar3 = *plVar9;
      *(undefined8 *)(lVar3 + 0x28) = 0;
      *(undefined8 *)(lVar3 + 0x30) = 0;
      lVar3 = *plVar9;
      *(undefined8 *)(lVar3 + 0x18) = 0;
      *(undefined8 *)(lVar3 + 0x20) = 0;
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::finalizeMemory() {
  auto& memory = wasm.memories[0];
  for (auto& segment : wasm.dataSegments) {
    Address maxOffset = segment->data.size();
    if (!segment->isPassive) {
      if (!wasm.features.hasGC()) {
        // Using a non-imported global in a segment offset is not valid in wasm
        // unless GC is enabled. This can occur due to us adding a local
        // definition to what used to be an imported global in initial contents.
        // To fix that, replace such invalid offsets with a constant.
        for ([[maybe_unused]] auto* get :
             FindAll<GlobalGet>(segment->offset).list) {
          // No imported globals should remain.
          assert(!wasm.getGlobal(get->name)->imported());
          // TODO: It would be better to avoid segment overlap so that
          //       MemoryPacking can run.
          segment->offset =
            builder.makeConst(Literal::makeFromInt32(0, memory->addressType));
        }
      }
      if (auto* offset = segment->offset->dynCast<Const>()) {
        maxOffset = maxOffset + offset->value.getInteger();
      }
    }

    // Ensure the initial memory can fit the segment (so we don't just trap),
    // but only do so when the segment is at a reasonable offset (to avoid
    // validation errors on the initial size >= 4GB in wasm32, but also to
    // avoid OOM errors on trying to allocate too much initial memory, which is
    // annoying in the fuzzer).
    Address ONE_GB = 1024 * 1024 * 1024;
    if (maxOffset <= ONE_GB) {
      memory->initial = std::max(
        memory->initial,
        Address((maxOffset + Memory::kPageSize - 1) / Memory::kPageSize));
    }
  }
  memory->initial = std::max(memory->initial, fuzzParams->USABLE_MEMORY);
  // Avoid an unlimited memory size, which would make fuzzing very difficult
  // as different VMs will run out of system memory in different ways.
  if (memory->max == Memory::kUnlimitedSize) {
    memory->max = memory->initial;
  }
  if (memory->max <= memory->initial) {
    // To allow growth to work (which a testcase may assume), try to make the
    // maximum larger than the initial.
    // TODO: scan the wasm for grow instructions?
    memory->max =
      std::min(Address(memory->initial + 1), Address(Memory::kMaxSize32));
  }

  if (!preserveImportsAndExports) {
    // Avoid an imported memory (which the fuzz harness would need to handle).
    for (auto& memory : wasm.memories) {
      memory->module = memory->base = Name();
    }
  }
}